

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_finishset(lua_State *L,TValue *t,TValue *key,TValue *val,int hres)

{
  Table *t_00;
  StkId pSVar1;
  int local_5c;
  Table *local_58;
  Table *x_;
  TValue *io;
  Table *h;
  TValue *tm;
  int loop;
  int hres_local;
  TValue *val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._0_4_ = 0;
  tm._4_4_ = hres;
  key_local = t;
  while( true ) {
    if (1999 < (int)tm) {
      luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
    }
    if (tm._4_4_ == 2) {
      h = (Table *)luaT_gettmbyobj(L,key_local,TM_NEWINDEX);
      if ((h->tt & 0xf) == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    else {
      t_00 = (Table *)(key_local->value_).gc;
      if ((t_00->metatable == (Table *)0x0) || ((t_00->metatable->flags & 2) != 0)) {
        local_58 = (Table *)0x0;
      }
      else {
        local_58 = (Table *)luaT_gettm(t_00->metatable,TM_NEWINDEX,L->l_G->tmname[1]);
      }
      h = local_58;
      if (local_58 == (Table *)0x0) {
        pSVar1 = (L->top).p;
        *(Table **)pSVar1 = t_00;
        (pSVar1->val).tt_ = 'E';
        (L->top).p = (StkId)((L->top).offset + 0x10);
        luaH_finishset(L,t_00,key,val,tm._4_4_);
        (L->top).p = (StkId)((L->top).offset + -0x10);
        t_00->flags = t_00->flags & 0xc0;
        if ((val->tt_ & 0x40) == 0) {
          return;
        }
        if ((t_00->marked & 0x20) == 0) {
          return;
        }
        if ((((val->value_).gc)->marked & 0x18) == 0) {
          return;
        }
        luaC_barrierback_(L,(GCObject *)t_00);
        return;
      }
    }
    if ((h->tt & 0xf) == 6) {
      luaT_callTM(L,(TValue *)h,key_local,key,val);
      return;
    }
    key_local = (TValue *)h;
    if (h->tt == 'E') {
      local_5c = luaH_pset((Table *)h->next,key,val);
    }
    else {
      local_5c = 2;
    }
    tm._4_4_ = local_5c;
    if (local_5c == 0) break;
    tm._0_4_ = (int)tm + 1;
  }
  if ((val->tt_ & 0x40) == 0) {
    return;
  }
  if ((h->next->marked & 0x20) == 0) {
    return;
  }
  if ((((val->value_).gc)->marked & 0x18) == 0) {
    return;
  }
  luaC_barrierback_(L,h->next);
  return;
}

Assistant:

void luaV_finishset (lua_State *L, const TValue *t, TValue *key,
                      TValue *val, int hres) {
  int loop;  /* counter to avoid infinite loops */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;  /* '__newindex' metamethod */
    if (hres != HNOTATABLE) {  /* is 't' a table? */
      Table *h = hvalue(t);  /* save 't' table */
      tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
      if (tm == NULL) {  /* no metamethod? */
        sethvalue2s(L, L->top.p, h);  /* anchor 't' */
        L->top.p++;  /* assume EXTRA_STACK */
        luaH_finishset(L, h, key, val, hres);  /* set new value */
        L->top.p--;
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else {  /* not a table; check metamethod */
      tm = luaT_gettmbyobj(L, t, TM_NEWINDEX);
      if (l_unlikely(notm(tm)))
        luaG_typeerror(L, t, "index");
    }
    /* try the metamethod */
    if (ttisfunction(tm)) {
      luaT_callTM(L, tm, t, key, val);
      return;
    }
    t = tm;  /* else repeat assignment over 'tm' */
    luaV_fastset(t, key, val, hres, luaH_pset);
    if (hres == HOK) {
      luaV_finishfastset(L, t, val);
      return;  /* done */
    }
    /* else 'return luaV_finishset(L, t, key, val, slot)' (loop) */
  }
  luaG_runerror(L, "'__newindex' chain too long; possible loop");
}